

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::SimpleAssignmentPatternExpression::forFixedArray
          (SimpleAssignmentPatternExpression *this,Compilation *comp,
          SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,Type *elementType,
          bitwidth_t numElements,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  Expression *expr;
  undefined4 in_stack_0000000c;
  bool *in_stack_ffffffffffffffc0;
  bool bad;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  
  bad = false;
  sourceRange_00.endLoc = (SourceLocation)&bad;
  sourceRange_00.startLoc = sourceRange.startLoc;
  elems = bindExpressionList((ast *)context,type,(Type *)0x1,(ulong)elementType & 0xffffffff,
                             (int)comp + 0x20,
                             (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)syntax,
                             (ASTContext *)CONCAT44(in_stack_0000000c,numElements),sourceRange_00,
                             in_stack_ffffffffffffffc0);
  expr = (Expression *)
         BumpAllocator::
         emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                   ((BumpAllocator *)this,(Type *)context,&elems,(SourceRange *)&numElements);
  if (bad == true) {
    expr = Expression::badExpr((Compilation *)this,expr);
  }
  return expr;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, bitwidth_t numElements, SourceRange sourceRange) {

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, numElements, syntax.items, context,
                                    sourceRange, bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, elems, sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}